

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

uECC_word_t regularize_k(uECC_word_t *k,uECC_word_t *k0,uECC_word_t *k1,uECC_Curve curve)

{
  short bit;
  char num_words;
  uECC_word_t uVar1;
  bool local_3a;
  bool local_39;
  uECC_word_t carry;
  bitcount_t num_n_bits;
  wordcount_t num_n_words;
  uECC_Curve curve_local;
  uECC_word_t *k1_local;
  uECC_word_t *k0_local;
  uECC_word_t *k_local;
  
  num_words = (char)((curve->num_n_bits + 0x3f) / 0x40);
  bit = curve->num_n_bits;
  uVar1 = uECC_vli_add(k0,k,curve->n,num_words);
  local_39 = true;
  if (uVar1 == 0) {
    local_3a = false;
    if ((int)bit < (short)num_words * 0x40) {
      uVar1 = uECC_vli_testBit(k0,bit);
      local_3a = uVar1 != 0;
    }
    local_39 = local_3a;
  }
  uECC_vli_add(k1,k0,curve->n,num_words);
  return (long)(int)(uint)local_39;
}

Assistant:

static uECC_word_t regularize_k(const uECC_word_t * const k,
                                uECC_word_t *k0,
                                uECC_word_t *k1,
                                uECC_Curve curve) {
    wordcount_t num_n_words = BITS_TO_WORDS(curve->num_n_bits);
    bitcount_t num_n_bits = curve->num_n_bits;
    uECC_word_t carry = uECC_vli_add(k0, k, curve->n, num_n_words) ||
        (num_n_bits < ((bitcount_t)num_n_words * uECC_WORD_SIZE * 8) &&
         uECC_vli_testBit(k0, num_n_bits));
    uECC_vli_add(k1, k0, curve->n, num_n_words);
    return carry;
}